

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

MaybeResult<wasm::Ok> *
wasm::WATParser::foldedinstr<wasm::WATParser::ParseModuleTypesCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseModuleTypesCtx *ctx)

{
  Lexer *this;
  _Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *this_00;
  pointer pIVar1;
  bool bVar2;
  pointer *this_01;
  int iVar3;
  string_view expected;
  string_view expected_00;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_> *local_168;
  undefined1 local_160 [8];
  MaybeResult<wasm::Ok> _val;
  MaybeResult<wasm::Ok> inst;
  undefined1 auStack_108 [8];
  NullCtx nullCtx;
  undefined1 auStack_a8 [8];
  vector<InstrInfo,_std::allocator<InstrInfo>_> foldedInstrs;
  _Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_> local_88;
  undefined1 local_60 [8];
  WithPosition<wasm::WATParser::ParseModuleTypesCtx> with;
  
  this = &ctx->in;
  bVar2 = Lexer::peekLParen(this);
  with.annotations.
  super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)__return_storage_ptr__;
  if (((!bVar2) ||
      (expected._M_str = "then", expected._M_len = 4, bVar2 = Lexer::peekSExprStart(this,expected),
      bVar2)) ||
     (expected_00._M_str = "else", expected_00._M_len = 4,
     bVar2 = Lexer::peekSExprStart(this,expected_00), bVar2)) {
    *(__index_type *)
     &with.annotations.
      super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage[1].kind.super_IString.str._M_len = '\x01';
  }
  else {
    auStack_a8 = (undefined1  [8])0x0;
    foldedInstrs.super__Vector_base<InstrInfo,_std::allocator<InstrInfo>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    foldedInstrs.super__Vector_base<InstrInfo,_std::allocator<InstrInfo>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_168 = &(ctx->in).annotations;
    this_00 = (_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
              ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20);
    do {
      bVar2 = Lexer::takeRParen(this);
      if (bVar2) {
        auStack_108 = (undefined1  [8])
                      foldedInstrs.super__Vector_base<InstrInfo,_std::allocator<InstrInfo>_>._M_impl
                      .super__Vector_impl_data._M_start[-1].start;
        nullCtx.in.pos =
             foldedInstrs.super__Vector_base<InstrInfo,_std::allocator<InstrInfo>_>._M_impl.
             super__Vector_impl_data._M_start[-1].end.
             super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>._M_payload._M_value;
        nullCtx.in.annotations.
        super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
        ._M_impl.super__Vector_impl_data._M_start =
             *(pointer *)
              &foldedInstrs.super__Vector_base<InstrInfo,_std::allocator<InstrInfo>_>._M_impl.
               super__Vector_impl_data._M_start[-1].end.
               super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._M_engaged;
        nullCtx.in.annotations.
        super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             foldedInstrs.super__Vector_base<InstrInfo,_std::allocator<InstrInfo>_>._M_impl.
             super__Vector_impl_data._M_start[-1].annotations.
             super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
             ._M_impl.super__Vector_impl_data._M_start;
        nullCtx.in.annotations.
        super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             foldedInstrs.super__Vector_base<InstrInfo,_std::allocator<InstrInfo>_>._M_impl.
             super__Vector_impl_data._M_start[-1].annotations.
             super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        nullCtx.in.file.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_dataplus._M_p =
             (_Alloc_hider)
             foldedInstrs.super__Vector_base<InstrInfo,_std::allocator<InstrInfo>_>._M_impl.
             super__Vector_impl_data._M_start[-1].annotations.
             super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        foldedInstrs.super__Vector_base<InstrInfo,_std::allocator<InstrInfo>_>._M_impl.
        super__Vector_impl_data._M_start[-1].annotations.
        super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        foldedInstrs.super__Vector_base<InstrInfo,_std::allocator<InstrInfo>_>._M_impl.
        super__Vector_impl_data._M_start[-1].annotations.
        super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        foldedInstrs.super__Vector_base<InstrInfo,_std::allocator<InstrInfo>_>._M_impl.
        super__Vector_impl_data._M_start[-1].annotations.
        super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        if ((char)nullCtx.in.annotations.
                  super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                  ._M_impl.super__Vector_impl_data._M_start == '\0') {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1c8,"unexpected end of folded instruction",
                     (allocator<char> *)
                     ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
          Lexer::err((Err *)local_60,this,&local_1c8);
          std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
          _Variant_storage<2ul,wasm::Err>
                    ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)
                     with.annotations.
                     super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,local_60);
          std::__cxx11::string::~string((string *)local_60);
          std::__cxx11::string::~string((string *)&local_1c8);
LAB_00c3fac0:
          this_01 = &nullCtx.in.annotations.
                     super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
LAB_00c3fac7:
          std::
          _Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>::
          ~_Vector_base((_Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                         *)this_01);
          goto LAB_00c3facc;
        }
        pIVar1 = foldedInstrs.super__Vector_base<InstrInfo,_std::allocator<InstrInfo>_>._M_impl.
                 super__Vector_impl_data._M_start + -1;
        foldedInstrs.super__Vector_base<InstrInfo,_std::allocator<InstrInfo>_>._M_impl.
        super__Vector_impl_data._M_start =
             foldedInstrs.super__Vector_base<InstrInfo,_std::allocator<InstrInfo>_>._M_impl.
             super__Vector_impl_data._M_start + -1;
        std::_Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
        ::~_Vector_base(&(pIVar1->annotations).
                         super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                       );
        WithPosition<wasm::WATParser::ParseModuleTypesCtx>::WithPosition
                  ((WithPosition<wasm::WATParser::ParseModuleTypesCtx> *)local_60,ctx,
                   auStack_108._0_4_);
        plaininstr<wasm::WATParser::ParseModuleTypesCtx>
                  ((MaybeResult<wasm::Ok> *)this_00,ctx,
                   (vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                    *)&nullCtx.in.annotations.
                       super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
        if (inst.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x01') {
          __assert_fail("inst && \"unexpectedly failed to parse instruction\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/parser/parsers.h"
                        ,0x3fa,
                        "MaybeResult<> wasm::WATParser::foldedinstr(Ctx &) [Ctx = wasm::WATParser::ParseModuleTypesCtx]"
                       );
        }
        std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err>::
        _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_160,
                        (_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)this_00);
        if (_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x02') {
          std::__cxx11::string::string((string *)&local_88,(string *)local_160);
          std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
          _Variant_storage<2ul,wasm::Err>
                    ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)
                     with.annotations.
                     super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_88);
          std::__cxx11::string::~string((string *)&local_88);
          std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
          ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_160);
LAB_00c3faab:
          std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
          ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                            ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20))
          ;
          WithPosition<wasm::WATParser::ParseModuleTypesCtx>::~WithPosition
                    ((WithPosition<wasm::WATParser::ParseModuleTypesCtx> *)local_60);
          goto LAB_00c3fac0;
        }
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_160);
        if (this->pos != nullCtx.in.pos) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1a8,"expected end of instruction",(allocator<char> *)&local_88
                    );
          Lexer::err((Err *)local_160,this,&local_1a8);
          std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
          _Variant_storage<2ul,wasm::Err>
                    ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)
                     with.annotations.
                     super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,local_160);
          std::__cxx11::string::~string((string *)local_160);
          std::__cxx11::string::~string((string *)&local_1a8);
          goto LAB_00c3faab;
        }
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
        ~_Variant_storage(this_00);
        WithPosition<wasm::WATParser::ParseModuleTypesCtx>::~WithPosition
                  ((WithPosition<wasm::WATParser::ParseModuleTypesCtx> *)local_60);
        std::_Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
        ::~_Vector_base((_Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                         *)&nullCtx.in.annotations.
                            super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                            ._M_impl.super__Vector_impl_data._M_finish);
      }
      else {
        local_88._M_impl.super__Vector_impl_data._M_start =
             (ctx->in).annotations.
             super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_88._M_impl.super__Vector_impl_data._M_finish =
             (ctx->in).annotations.
             super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_88._M_impl.super__Vector_impl_data._M_end_of_storage =
             (ctx->in).annotations.
             super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (local_168->
        super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (local_168->
        super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
        )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (local_168->
        super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        foldedBlockinstr<wasm::WATParser::ParseModuleTypesCtx>
                  ((MaybeResult<wasm::Ok> *)auStack_108,ctx,
                   (vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                    *)&local_88);
        iVar3 = 0;
        if ((char)nullCtx.in.annotations.
                  super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage != '\x01') {
          std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err>::
          _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_60,
                          (_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)auStack_108);
          iVar3 = 3;
          if ((char)with.annotations.
                    super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                    ._M_impl.super__Vector_impl_data._M_finish == '\x02') {
            std::__cxx11::string::string((string *)this_00,(string *)local_60);
            std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
            _Variant_storage<2ul,wasm::Err>
                      ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)
                       with.annotations.
                       super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,this_00);
            std::__cxx11::string::~string((string *)this_00);
            iVar3 = 1;
          }
          std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
          ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_60);
        }
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)auStack_108);
        if (iVar3 == 0) {
          bVar2 = Lexer::takeLParen(this);
          if (!bVar2) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_188,"expected folded instruction",
                       (allocator<char> *)local_60);
            Lexer::err((Err *)auStack_108,this,&local_188);
            std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
            _Variant_storage<2ul,wasm::Err>
                      ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)
                       with.annotations.
                       super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,auStack_108);
            std::__cxx11::string::~string((string *)auStack_108);
            std::__cxx11::string::~string((string *)&local_188);
            this_01 = (pointer *)&local_88;
            goto LAB_00c3fac7;
          }
          auStack_108 = (undefined1  [8])this->pos;
          nullCtx.in.annotations.
          super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)((ulong)nullCtx.in.annotations.
                                super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                                ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
          nullCtx.in.annotations.
          super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_88._M_impl.super__Vector_impl_data._M_start;
          nullCtx.in.annotations.
          super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               local_88._M_impl.super__Vector_impl_data._M_finish;
          nullCtx.in.file.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._M_value._M_dataplus._M_p =
               (_Alloc_hider)
               (_Alloc_hider)local_88._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::
          vector<wasm::WATParser::foldedinstr<wasm::WATParser::ParseModuleTypesCtx>(wasm::WATParser::ParseModuleTypesCtx&)::InstrInfo,std::allocator<wasm::WATParser::foldedinstr<wasm::WATParser::ParseModuleTypesCtx>(wasm::WATParser::ParseModuleTypesCtx&)::InstrInfo>>
          ::
          emplace_back<wasm::WATParser::foldedinstr<wasm::WATParser::ParseModuleTypesCtx>(wasm::WATParser::ParseModuleTypesCtx&)::InstrInfo>
                    ((vector<wasm::WATParser::foldedinstr<wasm::WATParser::ParseModuleTypesCtx>(wasm::WATParser::ParseModuleTypesCtx&)::InstrInfo,std::allocator<wasm::WATParser::foldedinstr<wasm::WATParser::ParseModuleTypesCtx>(wasm::WATParser::ParseModuleTypesCtx&)::InstrInfo>>
                      *)auStack_a8,(InstrInfo *)auStack_108);
          std::
          _Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>::
          ~_Vector_base((_Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                         *)&nullCtx.in.annotations.
                            super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                            ._M_impl.super__Vector_impl_data._M_finish);
          Lexer::Lexer((Lexer *)auStack_108,this);
          _val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_index = '\0';
          _val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._33_7_ = 0;
          plaininstr<wasm::WATParser::NullCtx>
                    ((MaybeResult<wasm::Ok> *)local_60,(NullCtx *)auStack_108,
                     (vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                      *)this_00);
          std::
          _Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>::
          ~_Vector_base((_Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                         *)this_00);
          if ((char)with.annotations.
                    super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                    ._M_impl.super__Vector_impl_data._M_finish == '\x01') {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1e8,"expected instruction",(allocator<char> *)local_160);
            Lexer::err((Err *)this_00,this,&local_1e8);
            std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
            _Variant_storage<2ul,wasm::Err>
                      ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)
                       with.annotations.
                       super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,this_00);
            std::__cxx11::string::~string((string *)this_00);
            std::__cxx11::string::~string((string *)&local_1e8);
LAB_00c3f934:
            std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_60);
            iVar3 = 1;
          }
          else {
            std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err>::
            _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)this_00,
                            (_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_60);
            if (inst.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x02')
            {
              std::__cxx11::string::string((string *)local_160,(string *)this_00);
              std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
              _Variant_storage<2ul,wasm::Err>
                        ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)
                         with.annotations.
                         super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_160);
              std::__cxx11::string::~string((string *)local_160);
              std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
              ~_Variant_storage(this_00);
              goto LAB_00c3f934;
            }
            std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
            ~_Variant_storage(this_00);
            Lexer::operator=(this,(Lexer *)auStack_108);
            std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_60);
            if (foldedInstrs.super__Vector_base<InstrInfo,_std::allocator<InstrInfo>_>._M_impl.
                super__Vector_impl_data._M_start[-1].end.
                super__Optional_base<unsigned_long,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_long>._M_engaged == true) {
              __assert_fail("!foldedInstrs.back().end",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/parser/parsers.h"
                            ,0x421,
                            "MaybeResult<> wasm::WATParser::foldedinstr(Ctx &) [Ctx = wasm::WATParser::ParseModuleTypesCtx]"
                           );
            }
            foldedInstrs.super__Vector_base<InstrInfo,_std::allocator<InstrInfo>_>._M_impl.
            super__Vector_impl_data._M_start[-1].end.super__Optional_base<unsigned_long,_true,_true>
            ._M_payload.super__Optional_payload_base<unsigned_long>._M_payload =
                 (_Storage<unsigned_long,_true>)this->pos;
            foldedInstrs.super__Vector_base<InstrInfo,_std::allocator<InstrInfo>_>._M_impl.
            super__Vector_impl_data._M_start[-1].end.super__Optional_base<unsigned_long,_true,_true>
            ._M_payload.super__Optional_payload_base<unsigned_long>._M_engaged = true;
            iVar3 = 0;
          }
          Lexer::~Lexer((Lexer *)auStack_108);
        }
        std::_Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
        ::~_Vector_base(&local_88);
        if ((iVar3 != 3) && (iVar3 != 0)) goto LAB_00c3facc;
      }
    } while (auStack_a8 !=
             (undefined1  [8])
             foldedInstrs.super__Vector_base<InstrInfo,_std::allocator<InstrInfo>_>._M_impl.
             super__Vector_impl_data._M_start);
    *(undefined1 *)
     &with.annotations.
      super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage[1].kind.super_IString.str._M_len = 0;
LAB_00c3facc:
    std::vector<InstrInfo,_std::allocator<InstrInfo>_>::~vector
              ((vector<InstrInfo,_std::allocator<InstrInfo>_> *)auStack_a8);
  }
  return (MaybeResult<wasm::Ok> *)
         with.annotations.
         super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
}

Assistant:

MaybeResult<> foldedinstr(Ctx& ctx) {
  // We must have an '(' to start a folded instruction.
  if (!ctx.in.peekLParen()) {
    return {};
  }

  // Check for valid strings that look like folded instructions but are not.
  if (ctx.in.peekSExprStart("then"sv) || ctx.in.peekSExprStart("else")) {
    return {};
  }

  // A stack of (start, end) position pairs defining the positions of
  // instructions that need to be parsed after their folded children.
  struct InstrInfo {
    size_t start;
    std::optional<size_t> end;
    std::vector<Annotation> annotations;
  };
  std::vector<InstrInfo> foldedInstrs;

  do {
    if (ctx.in.takeRParen()) {
      // We've reached the end of a folded instruction. Parse it for real.
      auto info = std::move(foldedInstrs.back());
      if (!info.end) {
        return ctx.in.err("unexpected end of folded instruction");
      }
      foldedInstrs.pop_back();

      WithPosition with(ctx, info.start);
      auto inst = plaininstr(ctx, std::move(info.annotations));
      assert(inst && "unexpectedly failed to parse instruction");
      CHECK_ERR(inst);
      // We have already parsed the instruction, so we generally know where it
      // ends. But there may have been some invalid extra immediates (e.g.
      // invalid memory indices) that we only realize are invalid now that we've
      // parsed the instruction for real.
      if (ctx.in.getPos() != *info.end) {
        return ctx.in.err("expected end of instruction");
      }
      continue;
    }

    auto annotations = ctx.in.takeAnnotations();

    // We're not ending an instruction, so we must be starting a new one. Maybe
    // it is a block instruction.
    if (auto blockinst = foldedBlockinstr(ctx, annotations)) {
      CHECK_ERR(blockinst);
      continue;
    }

    // We must be starting a new plain instruction.
    if (!ctx.in.takeLParen()) {
      return ctx.in.err("expected folded instruction");
    }
    foldedInstrs.push_back({ctx.in.getPos(), {}, std::move(annotations)});

    // Consume the span for the instruction without meaningfully parsing it yet.
    // It will be parsed for real using the real context after its s-expression
    // children have been found and parsed.
    NullCtx nullCtx(ctx.in);
    if (auto inst = plaininstr(nullCtx, {})) {
      CHECK_ERR(inst);
      ctx.in = nullCtx.in;
    } else {
      return ctx.in.err("expected instruction");
    }

    // The folded instruction we just started ends here.
    assert(!foldedInstrs.back().end);
    foldedInstrs.back().end = ctx.in.getPos();
  } while (!foldedInstrs.empty());

  return Ok{};
}